

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O1

size_t merge_existing_groups
                 (econf_file *dest_kf,file_entry **fe,econf_file *uf,econf_file *ef,size_t etc_start
                 )

{
  file_entry *pfVar1;
  file_entry *pfVar2;
  file_entry fe_00;
  file_entry fe_01;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong local_c0;
  size_t local_b0;
  size_t local_a8;
  file_entry local_68;
  
  local_c0 = etc_start;
  if (ef != (econf_file *)0x0 && uf != (econf_file *)0x0) {
    uVar10 = uf->length;
    uVar12 = 0;
    local_b0 = etc_start;
    local_a8 = etc_start;
    do {
      if ((uVar12 == uVar10) ||
         ((uVar12 != 0 &&
          (iVar7 = strcmp(uf->file_entry[uVar12].group,uf->file_entry[uVar12 - 1].group), iVar7 != 0
          )))) {
        if (etc_start < ef->length) {
          sVar11 = etc_start;
          do {
            pfVar1 = ef->file_entry;
            iVar7 = strcmp(uf->file_entry[uVar12 - 1].group,pfVar1[sVar11].group);
            if (iVar7 == 0) {
              if (local_c0 < local_a8 + uVar12) {
                pfVar2 = *fe;
                pcVar9 = pfVar1[sVar11].key;
                lVar8 = local_c0 * 0x38 + 0x10;
                uVar10 = local_c0;
                do {
                  iVar7 = strcmp(*(char **)((long)pfVar2 + lVar8 + -8),pcVar9);
                  if (iVar7 == 0) {
                    free(*(void **)((long)&pfVar2->group + lVar8));
                    pcVar9 = ef->file_entry[sVar11].value;
                    if (pcVar9 == (char *)0x0) {
                      pcVar9 = "";
                    }
                    pcVar9 = strdup(pcVar9);
                    *(char **)((long)&(*fe)->group + lVar8) = pcVar9;
                    goto LAB_00105947;
                  }
                  uVar10 = uVar10 + 1;
                  lVar8 = lVar8 + 0x38;
                } while (uVar10 < local_a8 + uVar12);
              }
              pfVar1 = *fe;
              pfVar2 = ef->file_entry;
              uVar3 = pfVar2[sVar11].group;
              uVar4 = pfVar2[sVar11].key;
              fe_00.key = (char *)uVar4;
              fe_00.group = (char *)uVar3;
              fe_00.value = pfVar2[sVar11].value;
              fe_00.comment_before_key = (&pfVar2[sVar11].value)[1];
              fe_00.comment_after_value = pfVar2[sVar11].comment_after_value;
              fe_00.line_number = (uint64_t)(&pfVar2[sVar11].comment_after_value)[1];
              fe_00.quotes = pfVar2[sVar11].quotes;
              fe_00._49_7_ = *(undefined7 *)&pfVar2[sVar11].field_0x31;
              cpy_file_entry(&local_68,dest_kf,fe_00);
              pfVar1[uVar12 + local_b0].quotes = local_68.quotes;
              *(undefined7 *)&pfVar1[uVar12 + local_b0].field_0x31 = local_68._49_7_;
              pfVar1[uVar12 + local_b0].comment_after_value = local_68.comment_after_value;
              (&pfVar1[uVar12 + local_b0].comment_after_value)[1] = (char *)local_68.line_number;
              pfVar1[uVar12 + local_b0].value = local_68.value;
              (&pfVar1[uVar12 + local_b0].value)[1] = local_68.comment_before_key;
              pfVar1[uVar12 + local_b0].group = local_68.group;
              pfVar1[uVar12 + local_b0].key = local_68.key;
              local_b0 = local_b0 + 1;
            }
LAB_00105947:
            sVar11 = sVar11 + 1;
          } while (sVar11 < ef->length);
        }
        local_c0 = local_b0 + uVar12;
        local_a8 = local_b0;
      }
      if (uVar12 != uf->length) {
        pfVar1 = *fe;
        pfVar2 = uf->file_entry;
        uVar5 = pfVar2[uVar12].group;
        uVar6 = pfVar2[uVar12].key;
        fe_01.key = (char *)uVar6;
        fe_01.group = (char *)uVar5;
        fe_01.value = pfVar2[uVar12].value;
        fe_01.comment_before_key = (&pfVar2[uVar12].value)[1];
        fe_01.comment_after_value = pfVar2[uVar12].comment_after_value;
        fe_01.line_number = (uint64_t)(&pfVar2[uVar12].comment_after_value)[1];
        fe_01.quotes = pfVar2[uVar12].quotes;
        fe_01._49_7_ = *(undefined7 *)&pfVar2[uVar12].field_0x31;
        cpy_file_entry(&local_68,dest_kf,fe_01);
        pfVar1[uVar12 + local_b0].quotes = local_68.quotes;
        *(undefined7 *)&pfVar1[uVar12 + local_b0].field_0x31 = local_68._49_7_;
        pfVar1[uVar12 + local_b0].comment_after_value = local_68.comment_after_value;
        (&pfVar1[uVar12 + local_b0].comment_after_value)[1] = (char *)local_68.line_number;
        pfVar1[uVar12 + local_b0].value = local_68.value;
        (&pfVar1[uVar12 + local_b0].value)[1] = local_68.comment_before_key;
        pfVar1[uVar12 + local_b0].group = local_68.group;
        pfVar1[uVar12 + local_b0].key = local_68.key;
      }
      uVar12 = uVar12 + 1;
      uVar10 = uf->length;
    } while (uVar12 <= uVar10);
  }
  return local_c0;
}

Assistant:

size_t merge_existing_groups(econf_file *dest_kf, struct file_entry **fe, econf_file *uf,
			     econf_file *ef, const size_t etc_start) {
  bool new_key;
  size_t merge_length = etc_start, tmp = etc_start, added_keys = etc_start;
  if (uf && ef) {
    for (size_t i = 0; i <= uf->length; i++) {
      // Check if the group has changed in the last iteration
      if (i == uf->length ||
	  (i && strcmp(uf->file_entry[i].group, uf->file_entry[i - 1].group))) {
	for (size_t j = etc_start; j < ef->length; j++) {
	  // Check for matching groups
	  if (!strcmp(uf->file_entry[i - 1].group, ef->file_entry[j].group)) {
	    new_key = true;
	    for (size_t k = merge_length; k < i + tmp; k++) {
	      // If an existing key is found in ef take the value from ef
	      if (!strcmp((*fe)[k].key, ef->file_entry[j].key)) {
		free((*fe)[k].value);
		(*fe)[k].value = ef->file_entry[j].value ? strdup(ef->file_entry[j].value) : strdup("");
		new_key = false;
		break;
	      }
	    }
	    // If a new key is found for an existing group append it to the group
	    if (new_key)
	      (*fe)[i + added_keys++] = cpy_file_entry(dest_kf, ef->file_entry[j]);
	  }
	}
	merge_length = i + added_keys;
	// Temporary value to reduce amount of iterations in inner for loop
	tmp = added_keys;
      }
      if (i != uf->length)
	(*fe)[i + added_keys] = cpy_file_entry(dest_kf, uf->file_entry[i]);
    }
  }
  return merge_length;
}